

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void death_knowledge(player *p)

{
  uint32_t *puVar1;
  object *poVar2;
  store *psVar3;
  object *poVar4;
  time_t death_time;
  time_t local_20;
  
  psVar3 = store_home(p);
  local_20 = 0;
  if (p->total_winner != 0) {
    p->depth = 0;
    my_strcpy(p->died_from,"Ripe Old Age",0x50);
    p->exp = p->max_exp;
    p->lev = p->max_lev;
    p->au = p->au + 10000000;
  }
  player_learn_all_runes(p);
  for (poVar4 = p->gear; poVar4 != (object *)0x0; poVar4 = poVar4->next) {
    object_flavor_aware(p,poVar4);
    poVar2 = poVar4->known;
    poVar2->effect = poVar4->effect;
    poVar2->activation = poVar4->activation;
  }
  if (psVar3 != (store *)0x0) {
    for (poVar4 = psVar3->stock; poVar4 != (object *)0x0; poVar4 = poVar4->next) {
      object_flavor_aware(p,poVar4);
      poVar2 = poVar4->known;
      poVar2->effect = poVar4->effect;
      poVar2->activation = poVar4->activation;
    }
  }
  history_unmask_unknown(p);
  time(&local_20);
  enter_score(p,&local_20);
  puVar1 = &p->upkeep->update;
  *puVar1 = *puVar1 | 1;
  handle_stuff(p);
  return;
}

Assistant:

void death_knowledge(struct player *p)
{
	struct store *home = store_home(p);
	struct object *obj;
	time_t death_time = (time_t)0;

	/* Retire in the town in a good state */
	if (p->total_winner) {
		p->depth = 0;
		my_strcpy(p->died_from, "Ripe Old Age", sizeof(p->died_from));
		p->exp = p->max_exp;
		p->lev = p->max_lev;
		p->au += 10000000L;
	}

	player_learn_all_runes(p);
	for (obj = p->gear; obj; obj = obj->next) {
		object_flavor_aware(p, obj);
		obj->known->effect = obj->effect;
		obj->known->activation = obj->activation;
	}

	/* Thralls may not have a home */
	if (home) {
		for (obj = home->stock; obj; obj = obj->next) {
			object_flavor_aware(p, obj);
			obj->known->effect = obj->effect;
			obj->known->activation = obj->activation;
		}
	}

	history_unmask_unknown(p);

	/* Get time of death */
	(void)time(&death_time);
	enter_score(p, &death_time);

	/* Hack -- Recalculate bonuses */
	p->upkeep->update |= (PU_BONUS);
	handle_stuff(p);
}